

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

cmValue cmTargetPropertyComputer::GetSources<cmTarget>(cmTarget *tgt,cmMakefile *mf)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  pointer pcVar2;
  bool bVar3;
  pointer pbVar4;
  int iVar5;
  PolicyStatus PVar6;
  size_type sVar7;
  size_t sVar8;
  cmSourceFile *this;
  cmSourceFileLocation *pcVar9;
  ostream *poVar10;
  PolicyID id;
  pointer pBVar11;
  pointer input;
  string *psVar12;
  char *__s;
  string_view arg;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string objLibName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostringstream e;
  ostringstream ss;
  undefined1 auStack_3a8 [12];
  undefined4 local_39c;
  string local_398;
  cmMakefile *local_378;
  cmTarget *local_370;
  pointer local_368;
  pointer local_360;
  string local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  basic_string_view<char,_std::char_traits<char>_> local_320;
  long local_310 [12];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  _Var1._M_head_impl =
       (tgt->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  pBVar11 = *(pointer *)
             &((_Var1._M_head_impl)->SourceEntries).
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ;
  local_368 = *(pointer *)((long)&(_Var1._M_head_impl)->SourceEntries + 8);
  if (pBVar11 == local_368) {
    psVar12 = (string *)0x0;
  }
  else {
    local_378 = mf;
    local_370 = tgt;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    __s = "";
    do {
      arg._M_str = *(char **)&pBVar11->Value;
      arg._M_len = *(size_type *)((long)&pBVar11->Value + 8);
      local_360 = pBVar11;
      cmExpandedList_abi_cxx11_(&local_338,arg,false);
      pbVar4 = local_338.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (input = local_338.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; input != pbVar4; input = input + 1) {
        local_320._M_str = (input->_M_dataplus)._M_p;
        local_320._M_len = input->_M_string_length;
        __str._M_str = "$<TARGET_OBJECTS:";
        __str._M_len = 0x11;
        iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          (&local_320,0,0x11,__str);
        if ((iVar5 == 0) && ((input->_M_dataplus)._M_p[input->_M_string_length - 1] == '>')) {
          std::__cxx11::string::substr((ulong)&local_358,(ulong)input);
          sVar7 = cmGeneratorExpression::Find(&local_358);
          if (sVar7 == 0xffffffffffffffff) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
            PVar6 = cmMakefile::GetPolicyStatus(local_378,CMP0051,false);
            if (PVar6 - NEW < 3) {
              local_39c = (undefined4)CONCAT71((uint7)(uint3)(PVar6 >> 8),1);
              bVar3 = true;
            }
            else if (PVar6 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_398,(cmPolicies *)0x33,id);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_320,local_398._M_dataplus._M_p,
                                   local_398._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_dataplus._M_p != &local_398.field_2) {
                operator_delete(local_398._M_dataplus._M_p,
                                local_398.field_2._M_allocated_capacity + 1);
              }
              local_39c = 0;
              bVar3 = false;
            }
            else {
              bVar3 = true;
              local_39c = 0;
            }
            if (!bVar3) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_320,"Target \"",8);
              _Var1._M_head_impl =
                   (local_370->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_320,
                                   ((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                                   *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,
                         "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                         ,0x12d);
              std::__cxx11::stringbuf::str();
              cmMakefile::IssueMessage(local_378,AUTHOR_WARNING,&local_398);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_dataplus._M_p != &local_398.field_2) {
                operator_delete(local_398._M_dataplus._M_p,
                                local_398.field_2._M_allocated_capacity + 1);
              }
            }
            if ((char)local_39c != '\0') {
              if (__s == (char *)0x0) {
                std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) +
                                0x200);
              }
              else {
                sVar8 = strlen(__s);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(input->_M_dataplus)._M_p,input->_M_string_length);
              __s = ";";
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
            std::ios_base::~ios_base(local_2b0);
          }
          else {
            if (__s == (char *)0x0) {
              std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200)
              ;
            }
            else {
              sVar8 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(input->_M_dataplus)._M_p,input->_M_string_length);
            __s = ";";
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          sVar7 = cmGeneratorExpression::Find(input);
          if (sVar7 == 0xffffffffffffffff) {
            if (__s == (char *)0x0) {
              std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200)
              ;
            }
            else {
              sVar8 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(input->_M_dataplus)._M_p,input->_M_string_length);
            __s = ";";
          }
          else {
            this = cmMakefile::GetOrCreateSource
                             (((local_370->impl)._M_t.
                               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                               .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                              Makefile,input,false,Ambiguous);
            pcVar9 = cmSourceFile::GetLocation(this);
            local_320._M_len = (size_t)local_310;
            pcVar2 = (pcVar9->Directory)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_320,pcVar2,pcVar2 + (pcVar9->Directory)._M_string_length);
            if (local_320._M_str != (pointer)0x0) {
              std::__cxx11::string::append((char *)&local_320);
            }
            std::__cxx11::string::_M_append
                      ((char *)&local_320,(ulong)(pcVar9->Name)._M_dataplus._M_p);
            if (__s == (char *)0x0) {
              std::ios::clear((int)auStack_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200)
              ;
            }
            else {
              sVar8 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_320._M_len,(long)local_320._M_str);
            if ((long *)local_320._M_len != local_310) {
              operator_delete((void *)local_320._M_len,local_310[0] + 1);
            }
            __s = ";";
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_338);
      pBVar11 = local_360 + 1;
    } while (pBVar11 != local_368);
    if (GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_ == '\0') {
      GetSources<cmTarget>();
    }
    std::__cxx11::stringbuf::str();
    psVar12 = &GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_;
    std::__cxx11::string::operator=
              ((string *)&GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_,
               (string *)&local_320);
    if ((long *)local_320._M_len != local_310) {
      operator_delete((void *)local_320._M_len,local_310[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return (cmValue)psVar12;
}

Assistant:

cmValue cmTargetPropertyComputer::GetSources<cmTarget>(cmTarget const* tgt,
                                                       cmMakefile const& mf)
{
  cmBTStringRange entries = tgt->GetSourceEntries();
  if (entries.empty()) {
    return nullptr;
  }

  std::ostringstream ss;
  const char* sep = "";
  for (auto const& entry : entries) {
    std::vector<std::string> files = cmExpandedList(entry.Value);
    for (std::string const& file : files) {
      if (cmHasLiteralPrefix(file, "$<TARGET_OBJECTS:") &&
          file.back() == '>') {
        std::string objLibName = file.substr(17, file.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          ss << sep;
          sep = ";";
          ss << file;
          continue;
        }

        bool addContent = false;
        bool noMessage = true;
        std::ostringstream e;
        MessageType messageType = MessageType::AUTHOR_WARNING;
        switch (mf.GetPolicyStatus(cmPolicies::CMP0051)) {
          case cmPolicies::WARN:
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
            noMessage = false;
            CM_FALLTHROUGH;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::NEW:
            addContent = true;
            break;
        }
        if (!noMessage) {
          e << "Target \"" << tgt->GetName()
            << "\" contains $<TARGET_OBJECTS> generator expression in its "
               "sources list.  This content was not previously part of the "
               "SOURCES property when that property was read at configure "
               "time.  Code reading that property needs to be adapted to "
               "ignore the generator expression using the string(GENEX_STRIP) "
               "command.";
          mf.IssueMessage(messageType, e.str());
        }
        if (addContent) {
          ss << sep;
          sep = ";";
          ss << file;
        }
      } else if (cmGeneratorExpression::Find(file) == std::string::npos) {
        ss << sep;
        sep = ";";
        ss << file;
      } else {
        cmSourceFile* sf = tgt->GetMakefile()->GetOrCreateSource(file);
        // Construct what is known about this source file location.
        cmSourceFileLocation const& location = sf->GetLocation();
        std::string sname = location.GetDirectory();
        if (!sname.empty()) {
          sname += "/";
        }
        sname += location.GetName();

        ss << sep;
        sep = ";";
        // Append this list entry.
        ss << sname;
      }
    }
  }
  static std::string srcs;
  srcs = ss.str();
  return cmValue(srcs);
}